

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

bool __thiscall BamTools::FilterTool::FilterToolPrivate::ParseScript(FilterToolPrivate *this)

{
  undefined1 uVar1;
  bool bVar2;
  ostream *poVar3;
  Value *in_RDI;
  const_iterator cVar4;
  Value rule;
  string ruleString;
  stringstream convert;
  Value id;
  string filterName;
  Value filter;
  const_iterator filtersEnd;
  const_iterator filtersIter;
  int filterIndex;
  Value filters;
  bool success;
  bool ok;
  string errs;
  CharReaderBuilder rbuilder;
  Value root;
  istringstream sin;
  string document;
  undefined7 in_stack_fffffffffffff9e8;
  undefined1 in_stack_fffffffffffff9ef;
  FilterEngine<BamTools::BamAlignmentChecker> *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  ValueType in_stack_fffffffffffff9fc;
  CharReaderBuilder *in_stack_fffffffffffffa00;
  undefined6 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa26;
  undefined1 in_stack_fffffffffffffa27;
  undefined7 in_stack_fffffffffffffa68;
  allocator<char> local_579;
  string local_578 [32];
  string local_558 [32];
  Value local_538;
  string local_510 [32];
  string local_4f0 [32];
  stringstream local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined8 in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  FilterToolPrivate *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffbd8;
  Value *in_stack_fffffffffffffbe0;
  istream *in_stack_fffffffffffffbe8;
  Factory *in_stack_fffffffffffffbf0;
  Value *in_stack_fffffffffffffc08;
  string local_348 [32];
  Value local_328;
  string local_300 [72];
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  _Base_ptr local_298;
  undefined1 local_290;
  _Base_ptr local_288;
  undefined1 local_280;
  int local_274;
  Value local_270;
  byte local_241;
  undefined4 local_240;
  undefined1 local_239;
  string local_238 [136];
  istringstream local_1b0 [344];
  FilterToolPrivate *in_stack_ffffffffffffffa8;
  string local_30 [47];
  byte local_1;
  
  GetScriptContents_abi_cxx11_(in_stack_ffffffffffffffa8);
  std::__cxx11::istringstream::istringstream(local_1b0,local_30,_S_in);
  Json::Value::Value((Value *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc);
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffffa00);
  std::__cxx11::string::string(local_238);
  uVar1 = Json::parseFromStream
                    (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                     in_stack_fffffffffffffbd8);
  local_239 = uVar1;
  if ((bool)uVar1) {
    local_241 = 1;
    Json::Value::operator[]
              ((Value *)in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    Json::Value::Value(in_RDI,(Value *)CONCAT17(uVar1,in_stack_fffffffffffffa68));
    bVar2 = Json::Value::isNull(&local_270);
    if (bVar2) {
      in_stack_fffffffffffff9f0 = (FilterEngine<BamTools::BamAlignmentChecker> *)&local_579;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_578,"ROOT",(allocator *)in_stack_fffffffffffff9f0);
      local_241 = ParseFilterObject(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                    (Value *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_578);
      std::allocator<char>::~allocator(&local_579);
      local_1 = local_241 & 1;
      local_240 = 1;
    }
    else {
      local_274 = 0;
      cVar4 = Json::Value::begin((Value *)in_stack_fffffffffffff9f0);
      local_298 = (_Base_ptr)cVar4.super_ValueIteratorBase.current_._M_node;
      local_290 = cVar4.super_ValueIteratorBase.isNull_;
      local_288 = local_298;
      local_280 = local_290;
      cVar4 = Json::Value::end((Value *)in_stack_fffffffffffff9f0);
      local_2b8 = (_Base_ptr)cVar4.super_ValueIteratorBase.current_._M_node;
      in_stack_fffffffffffffa27 = cVar4.super_ValueIteratorBase.isNull_;
      local_2b0 = in_stack_fffffffffffffa27;
      local_2a8 = local_2b8;
      local_2a0 = in_stack_fffffffffffffa27;
      while (in_stack_fffffffffffffa26 =
                  Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)in_stack_fffffffffffff9f0,
                             (SelfType *)
                             CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8)),
            (bool)in_stack_fffffffffffffa26) {
        Json::ValueConstIterator::operator*((ValueConstIterator *)0x201031);
        Json::Value::Value(in_RDI,(Value *)CONCAT17(uVar1,in_stack_fffffffffffffa68));
        std::__cxx11::string::string(local_300);
        Json::Value::operator[]
                  ((Value *)in_stack_fffffffffffffa00,
                   (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        Json::Value::Value(in_RDI,(Value *)CONCAT17(uVar1,in_stack_fffffffffffffa68));
        bVar2 = Json::Value::isNull(&local_328);
        if (bVar2) {
          std::__cxx11::stringstream::stringstream(local_4d0);
          std::ostream::operator<<(local_4c0,local_274);
          std::__cxx11::stringstream::str();
          std::__cxx11::string::operator=(local_300,local_4f0);
          std::__cxx11::string::~string(local_4f0);
          std::__cxx11::stringstream::~stringstream(local_4d0);
        }
        else {
          Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffc08);
          std::__cxx11::string::operator=(local_300,local_348);
          std::__cxx11::string::~string(local_348);
        }
        bVar2 = ParseFilterObject(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                  (Value *)in_stack_fffffffffffffb60);
        local_241 = (local_241 & 1 & bVar2) != 0;
        Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffa27,
                                              CONCAT16(in_stack_fffffffffffffa26,
                                                       in_stack_fffffffffffffa20)));
        std::__cxx11::string::~string(local_300);
        Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffa27,
                                              CONCAT16(in_stack_fffffffffffffa26,
                                                       in_stack_fffffffffffffa20)));
        Json::ValueConstIterator::operator++((ValueConstIterator *)in_stack_fffffffffffff9f0);
        local_274 = local_274 + 1;
      }
      std::__cxx11::string::string(local_510);
      Json::Value::operator[]
                ((Value *)in_stack_fffffffffffffa00,
                 (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      Json::Value::Value(in_RDI,(Value *)CONCAT17(uVar1,in_stack_fffffffffffffa68));
      bVar2 = Json::Value::isString(&local_538);
      if (bVar2) {
        Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffc08);
        std::__cxx11::string::operator=(local_510,local_558);
        std::__cxx11::string::~string(local_558);
      }
      FilterEngine<BamTools::BamAlignmentChecker>::setRule
                (in_stack_fffffffffffff9f0,
                 (string *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8));
      local_1 = local_241 & 1;
      local_240 = 1;
      Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)));
      std::__cxx11::string::~string(local_510);
    }
    Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffa27,
                                          CONCAT16(in_stack_fffffffffffffa26,
                                                   in_stack_fffffffffffffa20)));
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "bamtools filter ERROR: failed to parse script - see error message(s) below"
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar3,local_238);
    local_1 = 0;
    local_240 = 1;
  }
  std::__cxx11::string::~string(local_238);
  Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)in_stack_fffffffffffff9f0);
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )));
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool FilterTool::FilterToolPrivate::ParseScript()
{

    // read in script contents from file
    const std::string document = GetScriptContents();
    std::istringstream sin(document);

    // set up JsonCPP reader and attempt to parse script
    Json::Value root;
    Json::CharReaderBuilder rbuilder;
    std::string errs;
    const bool ok = Json::parseFromStream(rbuilder, sin, &root, &errs);
    if (!ok) {
        // use built-in error reporting mechanism to alert user what was wrong with the script
        std::cerr << "bamtools filter ERROR: failed to parse script - see error message(s) below"
                  << std::endl
                  << errs;
        return false;
    }

    // initialize return status
    bool success = true;

    // see if root object contains multiple filters
    const Json::Value filters = root["filters"];
    if (!filters.isNull()) {

        // iterate over any filters found
        int filterIndex = 0;
        Json::Value::const_iterator filtersIter = filters.begin();
        Json::Value::const_iterator filtersEnd = filters.end();
        for (; filtersIter != filtersEnd; ++filtersIter, ++filterIndex) {
            Json::Value filter = (*filtersIter);

            // convert filter index to string
            std::string filterName;

            // if id tag supplied
            const Json::Value id = filter["id"];
            if (!id.isNull()) filterName = id.asString();

            // use array index
            else {
                std::stringstream convert;
                convert << filterIndex;
                filterName = convert.str();
            }

            // create & parse filter
            success &= ParseFilterObject(filterName, filter);
        }

        // see if user defined a "rule" for these filters
        // otherwise, use filter engine's default rule behavior
        std::string ruleString;
        const Json::Value rule = root["rule"];
        if (rule.isString()) ruleString = rule.asString();
        m_filterEngine.setRule(ruleString);

        // return success/fail
        return success;
    }

    // otherwise, root is the only filter (just contains properties)
    // create & parse filter named "ROOT"
    else
        success = ParseFilterObject("ROOT", root);

    // return success/failure
    return success;
}